

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Node * __thiscall rw::ColorQuant::createNode(ColorQuant *this,int32 level)

{
  LLLink *pLVar1;
  Node *pNVar2;
  long lVar3;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1117"
  ;
  pNVar2 = (Node *)(*DAT_00145dd8)(0xb0,0x30018);
  pNVar2->parent = (Node *)0x0;
  for (lVar3 = 4; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    pNVar2->children[lVar3 + -4] = (Node *)0x0;
  }
  (pNVar2->link).next = (LLLink *)0x0;
  (pNVar2->link).prev = (LLLink *)0x0;
  pNVar2->numPixels = 0;
  pNVar2->r = 0;
  pNVar2->g = 0;
  pNVar2->b = 0;
  pNVar2->a = 0;
  if (level == 0) {
    (pNVar2->link).next = &(this->leaves).link;
    pLVar1 = (this->leaves).link.prev;
    (pNVar2->link).prev = pLVar1;
    pLVar1->next = &pNVar2->link;
    (this->leaves).link.prev = &pNVar2->link;
  }
  return pNVar2;
}

Assistant:

ColorQuant::Node*
ColorQuant::createNode(int32 level)
{
	int i;
	ColorQuant::Node *node = rwNewT(ColorQuant::Node, 1, MEMDUR_EVENT | ID_IMAGE);
	node->parent = nil;
	for(i = 0; i < 16; i++)
		node->children[i] = nil;
	node->r = 0;
	node->g = 0;
	node->b = 0;
	node->a = 0;
	node->numPixels = 0;
	node->link.init();

	if(level == 0)
		this->leaves.append(&node->link);

	return node;
}